

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::RequestBuilder::~RequestBuilder(RequestBuilder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  Options *pOVar4;
  
  p_Var2 = (this->completion_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->completion_,(_Any_data *)&this->completion_,__destroy_functor);
  }
  pcVar3 = (this->url_)._M_dataplus._M_p;
  paVar1 = &(this->url_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pOVar4 = (this->options_)._M_t.
           super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>.
           _M_t.
           super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>.
           super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl;
  if (pOVar4 != (Options *)0x0) {
    operator_delete(pOVar4,8);
  }
  (this->options_)._M_t.
  super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>._M_t.
  super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>.
  super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl = (Options *)0x0;
  std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::~unique_ptr
            (&this->request_);
  return;
}

Assistant:

~RequestBuilder() {
        }